

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
* __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastInstancesIterator::
next(QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::BinaryResolutionConf::Lhs>
     *__return_storage_ptr__,FastInstancesIterator *this)

{
  Renaming *this_00;
  Literal *t;
  bool bVar1;
  int iVar2;
  Lhs *pLVar3;
  ResultSubstitution *pRVar4;
  RefCounter *pRVar5;
  uint uVar6;
  Literal *pLVar7;
  Renaming normalizer;
  Renaming local_60;
  undefined4 extraout_var;
  
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  pLVar3 = (Lhs *)CONCAT44(extraout_var,iVar2);
  if (this->_retrieveSubstitution == true) {
    this_00 = &this->_resultDenormalizer;
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
              (&this_00->_data);
    (this->_resultDenormalizer)._nextVar = 0;
    (this->_resultDenormalizer)._identity = true;
    t = ((pLVar3->super_SelectedLiteral).cl)->_literals[(int)(pLVar3->super_SelectedLiteral).litIdx]
    ;
    iVar2 = 0;
    pLVar7 = t;
    if (*(int *)&(t->super_Term).field_0xc < 0) {
      iVar2 = 0;
      do {
        pLVar7 = *(Literal **)&(pLVar7->super_Term).field_9._vars;
        if (((ulong)pLVar7 & 1) != 0) {
          uVar6 = 3;
          goto LAB_0034d02e;
        }
        iVar2 = iVar2 + 2;
      } while (*(int *)&(pLVar7->super_Term).field_0xc < 0);
    }
    uVar6 = (pLVar7->super_Term).field_9._vars;
LAB_0034d02e:
    if (iVar2 + uVar6 != 0) {
      local_60._data._timestamp = 1;
      local_60._data._size = 0;
      local_60._data._deleted = 0;
      local_60._data._capacityIndex = 0;
      local_60._data._capacity = 0;
      local_60._data._20_8_ = 0;
      local_60._data._28_8_ = 0;
      local_60._36_8_ = 0;
      local_60._identity = true;
      Kernel::Renaming::normalizeVariables(&local_60,t);
      Kernel::Renaming::makeInverse(this_00,&local_60);
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                (&local_60._data);
    }
    pRVar4 = (ResultSubstitution *)
             Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    pRVar4->_vptr_ResultSubstitution = (_func_int **)&PTR__ResultSubstitution_00b2dc78;
    pRVar4[1]._vptr_ResultSubstitution = (_func_int **)&this->_subst;
    pRVar4[2]._vptr_ResultSubstitution = (_func_int **)this_00;
    pRVar5 = (RefCounter *)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    (__return_storage_ptr__->unifier)._obj = pRVar4;
    (__return_storage_ptr__->unifier)._refCnt = pRVar5;
    __return_storage_ptr__->data = pLVar3;
    pRVar5->_val = 1;
  }
  else {
    (__return_storage_ptr__->unifier)._obj = (ResultSubstitution *)0x0;
    (__return_storage_ptr__->unifier)._refCnt = (RefCounter *)0x0;
    __return_storage_ptr__->data = pLVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}